

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O1

void __thiscall
openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::ResetSignKey
          (ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *this)

{
  char cVar1;
  pointer pvVar2;
  pointer puVar3;
  char cVar4;
  char cVar5;
  long lVar6;
  unsigned_long *index;
  pointer puVar7;
  
  if (this->vartype == SPIN) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              (&this->sign_key_,this->num_interactions_);
    if (0 < this->num_interactions_) {
      lVar6 = 0;
      do {
        pvVar2 = (this->poly_key_list_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar7 = pvVar2[lVar6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3 = *(pointer *)
                  ((long)&pvVar2[lVar6].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (puVar7 == puVar3) {
          cVar5 = '\x01';
        }
        else {
          cVar4 = '\x01';
          do {
            cVar1 = (char)(this->variables).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[*puVar7];
            cVar5 = cVar4 * cVar1;
            puVar7 = puVar7 + 1;
            cVar4 = cVar4 * cVar1;
          } while (puVar7 != puVar3);
        }
        (this->sign_key_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] = cVar5;
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->num_interactions_);
    }
    return;
  }
  return;
}

Assistant:

void ResetSignKey() {
    if (vartype != cimod::Vartype::SPIN) {
      return;
    }
    sign_key_.resize(num_interactions_);
#pragma omp parallel for
    for (int64_t i = 0; i < num_interactions_; ++i) {
      int8_t sign_key = 1;
      for (const auto &index : poly_key_list_[i]) {
        sign_key *= variables[index];
      }
      sign_key_[i] = sign_key;
    }
  }